

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

void GameLoop::start(void)

{
  undefined8 in_RAX;
  int gameModeChoice;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nWhich game mode do you want to play? \n 1 - Single game \n 2 - Tournament \n",0x4a
              );
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_28 + 4));
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x140528);
    std::istream::ignore((long)&std::cin,0x200);
  } while (uStack_28._4_4_ - 3U < 0xfffffffe);
  if (uStack_28._4_4_ == 2) {
    startTournament();
  }
  else {
    startSingle(false);
  }
  return;
}

Assistant:

void GameLoop::start() {
    int gameModeChoice;
    do {
        cout << "\nWhich game mode do you want to play? \n 1 - Single game \n 2 - Tournament \n";
        cin >> gameModeChoice;
        cin.clear();
        cin.ignore(512, '\n');
    } while (gameModeChoice < 1 || gameModeChoice > 2 || isnan(gameModeChoice));

    switch (gameModeChoice) {
        case 1:
            startSingle();
            break;
        case 2:
            startTournament();
            break;
        default:
            startSingle();
            break;
    }
}